

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

_Bool cs_reg_write(csh ud,cs_insn *insn,uint reg_id)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  
  if (ud != 0) {
    if (*(int *)(ud + 0x68) != 0) {
      if (insn->id == 0) {
        *(undefined4 *)(ud + 0x58) = 0xb;
        return false;
      }
      pcVar1 = insn->detail;
      if (pcVar1 != (cs_detail *)0x0) {
        _Var2 = arr_exist(pcVar1->regs_write,pcVar1->regs_write_count,reg_id);
        return _Var2;
      }
    }
    *(undefined4 *)(ud + 0x58) = 7;
  }
  return false;
}

Assistant:

CAPSTONE_API cs_reg_write(csh ud, const cs_insn *insn, unsigned int reg_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist(insn->detail->regs_write, insn->detail->regs_write_count, reg_id);
}